

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O0

int libssh2_channel_forward_cancel(LIBSSH2_LISTENER *listener)

{
  time_t start_time;
  time_t entry_time;
  int rc;
  LIBSSH2_LISTENER *listener_local;
  
  if (listener == (LIBSSH2_LISTENER *)0x0) {
    listener_local._4_4_ = -0x27;
  }
  else {
    start_time = time((time_t *)0x0);
    do {
      entry_time._4_4_ = _libssh2_channel_forward_cancel(listener);
      if (((entry_time._4_4_ != -0x25) || (listener->session == (LIBSSH2_SESSION *)0x0)) ||
         (listener->session->api_block_mode == 0)) break;
      entry_time._4_4_ = _libssh2_wait_socket(listener->session,start_time);
    } while (entry_time._4_4_ == 0);
    listener_local._4_4_ = entry_time._4_4_;
  }
  return listener_local._4_4_;
}

Assistant:

LIBSSH2_API int
libssh2_channel_forward_cancel(LIBSSH2_LISTENER *listener)
{
    int rc;

    if(!listener)
        return LIBSSH2_ERROR_BAD_USE;

    BLOCK_ADJUST(rc, listener->session,
                 _libssh2_channel_forward_cancel(listener));
    return rc;
}